

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O0

bool __thiscall
Indexing::ClauseCodeTree::ClauseMatcher::checkCandidate
          (ClauseMatcher *this,Clause *cl,int *resolvedQueryLit)

{
  MatchInfo *pMVar1;
  bool bVar2;
  ILStruct *pIVar3;
  ulong uVar4;
  MatchInfo **ppMVar5;
  LitInfo *pLVar6;
  LiteralMatcher *this_00;
  uint *in_RDX;
  Clause *in_RSI;
  long in_RDI;
  LiteralMatcher *lm;
  int i_1;
  bool newMatches;
  MatchInfo *mi;
  size_t i;
  size_t matchCnt;
  uint clen;
  ILStruct *in_stack_ffffffffffffffb0;
  uint local_48;
  ulong local_38;
  LiteralMatcher *in_stack_ffffffffffffffd0;
  bool local_1;
  
  local_48 = Kernel::Clause::length(in_RSI);
  if (local_48 < 2) {
    *in_RDX = 0xffffffff;
    if (((*(byte *)(in_RDI + 0x10) & 1) != 0) && (local_48 == 1)) {
      Lib::
      Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
      ::operator[]((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                    *)(in_RDI + 0x30),0);
      Lib::
      Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>::
      operator->((Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                  *)0x2f72a2);
      pIVar3 = LiteralMatcher::getILS((LiteralMatcher *)0x2f72aa);
      uVar4 = (ulong)pIVar3->matchCnt;
      for (local_38 = 0; local_38 < uVar4; local_38 = local_38 + 1) {
        Lib::
        Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
        ::operator[]((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                      *)(in_RDI + 0x30),0);
        Lib::
        Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>::
        operator->((Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                    *)0x2f72e4);
        LiteralMatcher::getILS((LiteralMatcher *)0x2f72ec);
        ppMVar5 = CodeTree::ILStruct::getMatch
                            (in_stack_ffffffffffffffb0,(uint)((ulong)in_RDI >> 0x20));
        pMVar1 = *ppMVar5;
        pLVar6 = Lib::DArray<Indexing::CodeTree::LitInfo>::operator[]
                           ((DArray<Indexing::CodeTree::LitInfo> *)(in_RDI + 0x18),
                            (ulong)*(uint *)pMVar1);
        if ((pLVar6->opposite & 1U) == 0) {
          *in_RDX = 0xffffffff;
          break;
        }
        pLVar6 = Lib::DArray<Indexing::CodeTree::LitInfo>::operator[]
                           ((DArray<Indexing::CodeTree::LitInfo> *)(in_RDI + 0x18),
                            (ulong)*(uint *)pMVar1);
        *in_RDX = pLVar6->litIndex;
      }
    }
    local_1 = true;
  }
  else {
    while (local_48 = local_48 - 1, -1 < (int)local_48) {
      Lib::
      Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
      ::operator[]((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                    *)(in_RDI + 0x30),(long)(int)local_48);
      this_00 = Lib::
                Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                ::operator*((Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                             *)0x2f73a0);
      bVar2 = LiteralMatcher::eagerlyMatched(this_00);
      if (bVar2) break;
      pIVar3 = LiteralMatcher::getILS((LiteralMatcher *)0x2f73c1);
      if (pIVar3->varCnt != 0) {
        LiteralMatcher::doEagerMatching(in_stack_ffffffffffffffd0);
      }
    }
    local_1 = matchGlobalVars(this,(int *)cl);
  }
  return local_1;
}

Assistant:

bool ClauseCodeTree::ClauseMatcher::checkCandidate(Clause* cl, int& resolvedQueryLit)
{
  unsigned clen=cl->length();
  //the last matcher in mls is the one that yielded the SUCCESS operation
  ASS_EQ(clen, lms.size()-1);
  ASS_EQ(clen, lms[clen-1]->op->getILS()->depth+1);

  if(clen<=1) {
    //if clause doesn't have multiple literals, there is no need
    //for multi-literal matching
    resolvedQueryLit=-1;
    if(sres && clen==1) {
      size_t matchCnt=lms[0]->getILS()->matchCnt;
      for(size_t i=0;i<matchCnt;i++) {
	MatchInfo* mi=lms[0]->getILS()->getMatch(i);
	if(lInfos[mi->liIndex].opposite) {
	  resolvedQueryLit=lInfos[mi->liIndex].litIndex;
	}
	else {
	  //we prefer subsumption to subsumption resolution
	  resolvedQueryLit=-1;
	  break;
	}
      }
    }
    return true;
  }

//  if(matchGlobalVars(resolvedQueryLit)) {
//    return true;
//  }

  bool newMatches=false;
  for(int i=clen-1;i>=0;i--) {
    LiteralMatcher* lm = &*lms[i];
    if(lm->eagerlyMatched()) {
      break;
    }
    if(lm->getILS()->varCnt==0) {
      //If the index term is ground, at most two literals can be matched on
      //it (the second one is the opposite one in case we're performing the
      //subsumption resolution) We are here, so we have matched one already,
      //and we know that the query clause doesn't contain two equal or opposite
      //literals (or else it would have been simplified by duplicate literal
      //removal or by tautology deletion). Therefore we don't need to try
      //matching the rest of the query clause.
      continue;
    }
    newMatches|=lm->doEagerMatching();
  }
  (void)newMatches; // to prevent a warning
  return matchGlobalVars(resolvedQueryLit);
//  return newMatches && matchGlobalVars(resolvedQueryLit);
}